

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O1

bool __thiscall ComputeM7::Write(ComputeM7 *this,FILE *F_out,char *date,char *version)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer pp_Var4;
  ulong uVar5;
  
  iVar2 = fprintf((FILE *)F_out,"M7.1,%s,%s, , %6f,\n",this->m71);
  iVar3 = fprintf((FILE *)F_out,"M7.2,%s,%s, , %6f,\n",this->m72,date,version);
  bVar1 = 0 < iVar3 && 0 < iVar2;
  if ((0 < iVar3 && 0 < iVar2) &&
     (pp_Var4 = (this->m7Getter).algo_count.
                super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
     (this->m7Getter).algo_count.
     super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>._M_impl.
     super__Vector_impl_data._M_finish != pp_Var4)) {
    uVar5 = 0;
    do {
      iVar2 = fprintf((FILE *)F_out,"M7.3,%s,%s, %u, %6f,\n",
                      pp_Var4[uVar5]->algo_frequency / (double)(this->m7Getter).nb_tld_queried,date,
                      version,(ulong)pp_Var4[uVar5]->algo_code);
      bVar1 = 0 < iVar2;
      if (iVar2 < 1) break;
      uVar5 = uVar5 + 1;
      pp_Var4 = (this->m7Getter).algo_count.
                super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->m7Getter).algo_count.
                                   super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var4 >> 3))
    ;
  }
  if ((bVar1 != false) &&
     (pp_Var4 = (this->m7Getter).algo_count.
                super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
     (this->m7Getter).algo_count.
     super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>._M_impl.
     super__Vector_impl_data._M_finish != pp_Var4)) {
    uVar5 = 0;
    do {
      iVar2 = fprintf((FILE *)F_out,"M7.4,%s,%s, %u, %6f,\n",
                      pp_Var4[uVar5]->algo_frequency_cc / (double)(this->m7Getter).nb_cc_tld_queried
                      ,date,version,(ulong)pp_Var4[uVar5]->algo_code);
      bVar1 = 0 < iVar2;
      if (iVar2 < 1) {
        return bVar1;
      }
      uVar5 = uVar5 + 1;
      pp_Var4 = (this->m7Getter).algo_count.
                super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->m7Getter).algo_count.
                                   super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var4 >> 3))
    ;
  }
  return bVar1;
}

Assistant:

bool ComputeM7::Write(FILE * F_out, char const* date, char const* version)
{
    bool ret = true;

    ret = (fprintf(F_out, "M7.1,%s,%s, , %6f,\n", date, version, m71) > 0);
    ret &= (fprintf(F_out, "M7.2,%s,%s, , %6f,\n", date, version, m72) > 0);

    for (size_t j = 0; ret && j < m7Getter.algo_count.size(); j++) {
        double frequency = m7Getter.algo_count[j]->algo_frequency / ((double)m7Getter.nb_tld_queried);
        ret &= (fprintf(F_out, "M7.3,%s,%s, %u, %6f,\n", date, version, 
            m7Getter.algo_count[j]->algo_code, frequency) > 0);
    }

    for (size_t j = 0; ret && j < m7Getter.algo_count.size(); j++) {
        double frequency = m7Getter.algo_count[j]->algo_frequency_cc / ((double)m7Getter.nb_cc_tld_queried);
        ret &= (fprintf(F_out, "M7.4,%s,%s, %u, %6f,\n", date, version, 
            m7Getter.algo_count[j]->algo_code, frequency) > 0);
    }

    return ret;
}